

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O3

Symbol * __thiscall
slang::ast::Scope::lookupName
          (Scope *this,string_view name,LookupLocation location,
          bitmask<slang::ast::LookupFlags> flags)

{
  char *pcVar1;
  char *pcVar2;
  Symbol *pSVar3;
  NameSyntax *syntax;
  ASTContext *context;
  LookupResult result;
  ASTContext local_2a0;
  LookupResult local_268;
  
  pcVar1 = local_268.selectors.
           super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
           .firstElement;
  local_268.found = (Symbol *)0x0;
  local_268.systemSubroutine._0_5_ = 0;
  local_268.systemSubroutine._5_3_ = 0;
  local_268.upwardCount = 0;
  local_268.flags.m_bits = '\0';
  local_268.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .len = 0;
  local_268.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .cap = 4;
  pcVar2 = local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
           firstElement;
  local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
  local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
  local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  local_2a0.lookupIndex = location.index;
  local_2a0.flags.m_bits = 0;
  local_2a0.instanceOrProc = (Symbol *)0x0;
  local_2a0.firstTempVar = (TempVarSymbol *)0x0;
  local_2a0.randomizeDetails = (RandomizeDetails *)0x0;
  local_2a0.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_2a0.scope.ptr = this;
  local_268.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .data_ = (pointer)pcVar1;
  local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
       (pointer)pcVar2;
  syntax = Compilation::parseName(this->compilation,name);
  context = &local_2a0;
  Lookup::name(syntax,context,flags,&local_268);
  pSVar3 = local_268.found;
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&local_268.diagnostics,(EVP_PKEY_CTX *)context);
  if (local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ !=
      (pointer)pcVar2) {
    operator_delete(local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>
                    .data_);
  }
  if (local_268.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .data_ != (pointer)pcVar1) {
    operator_delete(local_268.selectors.
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    .data_);
  }
  return pSVar3;
}

Assistant:

const Symbol* Scope::lookupName(std::string_view name, LookupLocation location,
                                bitmask<LookupFlags> flags) const {
    LookupResult result;
    ASTContext context(*this, location);
    Lookup::name(compilation.parseName(name), context, flags, result);
    SLANG_ASSERT(result.selectors.empty());
    return result.found;
}